

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O0

Variant anon_unknown.dwarf_46d210::make_variant(char *str)

{
  cali_variant_t cVar1;
  char *data;
  size_t sVar2;
  Variant local_40;
  Variant local_30;
  char *local_20;
  char *str_local;
  Variant var;
  
  local_20 = str;
  cali::Variant::Variant((Variant *)&str_local);
  data = local_20;
  if (local_20 == (char *)0x0) {
    cali::Variant::Variant(&local_30,CALI_TYPE_STRING,"unknown",8);
    str_local = (char *)local_30.m_v.type_and_size;
    var.m_v.type_and_size = local_30.m_v.value.v_uint;
  }
  else {
    sVar2 = strlen(local_20);
    cali::Variant::Variant(&local_40,CALI_TYPE_STRING,data,sVar2 + 1);
    str_local = (char *)local_40.m_v.type_and_size;
    var.m_v.type_and_size = local_40.m_v.value.v_uint;
  }
  cVar1.value.v_uint = var.m_v.type_and_size;
  cVar1.type_and_size = (uint64_t)str_local;
  return (Variant)cVar1;
}

Assistant:

Variant make_variant(char* str)
{
    Variant var;

    if (nullptr == str) {
        var = Variant(CALI_TYPE_STRING, "unknown", 8);
    } else {
        var = Variant(CALI_TYPE_STRING, str, strlen(str) + 1);
    }

    return var;
}